

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_ispeer(nn_sock *self,int socktype)

{
  uint in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  if ((*(uint *)(*(long *)(in_RDI + 0x68) + 4) & 0xfff0) == (in_ESI & 0xfff0)) {
    local_4 = (**(code **)(*(long *)(in_RDI + 0x68) + 0x18))(in_ESI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_sock_ispeer (struct nn_sock *self, int socktype)
{
    /*  If the peer implements a different SP protocol it is not a valid peer.
        Checking it here ensures that even if faulty protocol implementation
        allows for cross-protocol communication, it will never happen
        in practice. */
    if ((self->socktype->protocol & 0xfff0) != (socktype  & 0xfff0))
        return 0;

    /*  As long as the peer speaks the same protocol, socket type itself
        decides which socket types are to be accepted. */
    return self->socktype->ispeer (socktype);
}